

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spp.cpp
# Opt level: O2

int __thiscall ncnn::SPP::forward(SPP *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float *pfVar1;
  uint uVar2;
  uint uVar3;
  bool bVar4;
  pointer piVar5;
  uint uVar6;
  undefined4 extraout_EAX;
  int iVar7;
  void *pvVar8;
  ulong uVar9;
  byte bVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  ulong uVar16;
  int iVar17;
  int k;
  int iVar18;
  ulong uVar19;
  int iVar20;
  long lVar21;
  uint uVar22;
  float fVar23;
  float fVar24;
  undefined1 auVar25 [16];
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  void *local_180;
  ulong local_178;
  int local_168;
  Mat m;
  Mat local_d8;
  Mat bottom_blob_bordered;
  vector<int,_std::allocator<int>_> _space_ofs;
  
  Mat::create(top_blob,(uint)~(-1 << ((char)this->pyramid_height * '\x02' & 0x1fU)) / 3,1,2,
              bottom_blob->elemsize,opt->blob_allocator);
  local_180 = top_blob->data;
  if ((local_180 != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
    iVar14 = 0;
    do {
      if (this->pyramid_height <= iVar14) {
        return 0;
      }
      bVar10 = (byte)iVar14;
      uVar6 = 1 << (bVar10 & 0x1f);
      uVar2 = bottom_blob->c;
      local_178._0_4_ = bottom_blob->w;
      local_178._4_4_ = bottom_blob->h;
      fVar23 = ceilf((1.0 / (float)(int)uVar6) * (float)(int)(undefined4)local_178);
      fVar24 = ceilf((1.0 / (float)(int)uVar6) * (float)(int)local_178._4_4_);
      iVar26 = (int)fVar23;
      iVar28 = (int)fVar24;
      iVar27 = (iVar26 << iVar14) - (undefined4)local_178;
      iVar29 = iVar28 - local_178._4_4_;
      Mat::Mat(&bottom_blob_bordered,bottom_blob);
      auVar25._0_4_ = -(uint)(0 < iVar27);
      auVar25._4_4_ = -(uint)(0 < iVar27);
      auVar25._8_4_ = -(uint)(0 < iVar29);
      auVar25._12_4_ = -(uint)(0 < iVar29);
      iVar7 = movmskpd(extraout_EAX,auVar25);
      local_168 = local_178._4_4_;
      if (iVar7 == 0) {
LAB_00145d62:
        uVar22 = iVar28 * iVar26;
        std::vector<int,_std::allocator<int>_>::vector
                  (&_space_ofs,(long)(int)uVar22,(allocator_type *)&m);
        piVar5 = _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar27 = 0;
        iVar7 = 0;
        if (0 < iVar26) {
          iVar7 = iVar26;
        }
        iVar29 = 0;
        if (0 < iVar28) {
          iVar29 = iVar28;
        }
        iVar15 = (int)local_178;
        iVar20 = 0;
        iVar17 = iVar7;
        for (iVar18 = 0; iVar18 != iVar29; iVar18 = iVar18 + 1) {
          for (lVar21 = 0; (long)iVar17 - (long)iVar27 != lVar21; lVar21 = lVar21 + 1) {
            _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_start[iVar27 + lVar21] = iVar20 + (int)lVar21;
          }
          iVar20 = (int)lVar21 + iVar20 + (iVar15 - iVar26);
          iVar17 = iVar17 + iVar7;
          iVar27 = iVar27 + iVar7;
        }
        if (this->pooling_type == 0) {
          if ((int)uVar22 < 1) {
            uVar22 = 0;
          }
          uVar3 = uVar6;
          if ((int)uVar6 < 1) {
            uVar3 = 0;
          }
          uVar13 = 0;
          if (0 < (int)uVar2) {
            uVar13 = (ulong)uVar2;
          }
          for (uVar9 = 0; uVar9 != uVar13; uVar9 = uVar9 + 1) {
            m.data = (void *)(bottom_blob_bordered.cstep * uVar9 * bottom_blob_bordered.elemsize +
                             (long)bottom_blob_bordered.data);
            local_d8.refcount = (int *)0x0;
            local_d8.elemsize = bottom_blob_bordered.elemsize;
            local_d8.elempack = bottom_blob_bordered.elempack;
            local_d8.allocator = bottom_blob_bordered.allocator;
            m.dims = 2;
            local_d8.w = bottom_blob_bordered.w;
            local_d8.h = bottom_blob_bordered.h;
            m.elempack = 1;
            m.refcount = (int *)0x0;
            local_d8.cstep = (size_t)(bottom_blob_bordered.h * bottom_blob_bordered.w);
            m.elemsize = 4;
            m.allocator = (Allocator *)0x0;
            m.w = iVar15;
            m.h = local_168;
            m.c = m.elempack;
            m.cstep = (long)(iVar15 * local_168);
            local_d8.data = m.data;
            local_d8.dims = m.dims;
            local_d8.c = m.elempack;
            Mat::~Mat(&local_d8);
            pvVar8 = (void *)((long)local_180 + uVar9 * (long)(int)(uVar6 << (bVar10 & 0x1f)) * 4);
            for (uVar12 = 0; uVar12 != uVar3; uVar12 = uVar12 + 1) {
              for (uVar16 = 0; uVar16 != uVar6; uVar16 = uVar16 + 1) {
                pfVar1 = (float *)((long)m.data +
                                  uVar16 * (long)iVar26 * 4 +
                                  (long)(int)(uVar12 * iVar28) * (long)m.w * m.elemsize);
                fVar23 = *pfVar1;
                for (uVar19 = 0; uVar22 != uVar19; uVar19 = uVar19 + 1) {
                  fVar24 = pfVar1[piVar5[uVar19]];
                  if (fVar23 <= fVar24) {
                    fVar23 = fVar24;
                  }
                }
                *(float *)((long)pvVar8 + uVar16 * 4) = fVar23;
              }
              pvVar8 = (void *)((long)pvVar8 + (long)(int)uVar6 * 4);
            }
            Mat::~Mat(&m);
          }
        }
        else if (this->pooling_type == 1) {
          uVar3 = uVar22;
          if ((int)uVar22 < 1) {
            uVar3 = 0;
          }
          uVar12 = uVar6;
          if ((int)uVar6 < 1) {
            uVar12 = 0;
          }
          uVar13 = 0;
          if (0 < (int)uVar2) {
            uVar13 = (ulong)uVar2;
          }
          for (uVar9 = 0; uVar9 != uVar13; uVar9 = uVar9 + 1) {
            m.data = (void *)(bottom_blob_bordered.cstep * uVar9 * bottom_blob_bordered.elemsize +
                             (long)bottom_blob_bordered.data);
            local_d8.refcount = (int *)0x0;
            local_d8.elemsize = bottom_blob_bordered.elemsize;
            local_d8.elempack = bottom_blob_bordered.elempack;
            local_d8.allocator = bottom_blob_bordered.allocator;
            m.dims = 2;
            local_d8.w = bottom_blob_bordered.w;
            local_d8.h = bottom_blob_bordered.h;
            m.elempack = 1;
            m.refcount = (int *)0x0;
            local_d8.cstep = (size_t)(bottom_blob_bordered.h * bottom_blob_bordered.w);
            m.elemsize = 4;
            m.allocator = (Allocator *)0x0;
            m.w = iVar15;
            m.h = local_168;
            m.c = m.elempack;
            m.cstep = (long)(iVar15 * local_168);
            local_d8.data = m.data;
            local_d8.dims = m.dims;
            local_d8.c = m.elempack;
            Mat::~Mat(&local_d8);
            pvVar8 = (void *)((long)local_180 + uVar9 * (long)(int)(uVar6 << (bVar10 & 0x1f)) * 4);
            for (uVar11 = 0; uVar11 != uVar12; uVar11 = uVar11 + 1) {
              for (uVar16 = 0; uVar16 != uVar6; uVar16 = uVar16 + 1) {
                fVar23 = 0.0;
                for (uVar19 = 0; uVar3 != uVar19; uVar19 = uVar19 + 1) {
                  fVar23 = fVar23 + *(float *)((long)m.data +
                                              (long)piVar5[uVar19] * 4 +
                                              uVar16 * (long)iVar26 * 4 +
                                              (long)(int)(uVar11 * iVar28) * (long)m.w * m.elemsize)
                  ;
                }
                *(float *)((long)pvVar8 + uVar16 * 4) = fVar23 * (1.0 / (float)(int)uVar22);
              }
              pvVar8 = (void *)((long)pvVar8 + (long)(int)uVar6 * 4);
            }
            Mat::~Mat(&m);
          }
        }
        local_180 = (void *)((long)local_180 +
                            (long)(int)((uVar2 << (bVar10 & 0x1f)) << (bVar10 & 0x1f)) * 4);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  (&_space_ofs.super__Vector_base<int,_std::allocator<int>_>);
        bVar4 = true;
      }
      else {
        iVar27 = (iVar27 + 1) / 2;
        iVar7 = (iVar29 + 1) / 2;
        copy_make_border(bottom_blob,&bottom_blob_bordered,iVar7,iVar7,iVar27,iVar27,0,0.0,opt);
        if ((bottom_blob_bordered.data != (void *)0x0) &&
           ((long)bottom_blob_bordered.c * bottom_blob_bordered.cstep != 0)) {
          local_178 = (ulong)(uint)bottom_blob_bordered.w;
          local_168 = bottom_blob_bordered.h;
          goto LAB_00145d62;
        }
        bVar4 = false;
      }
      Mat::~Mat(&bottom_blob_bordered);
      iVar14 = iVar14 + 1;
    } while (bVar4);
  }
  return -100;
}

Assistant:

int SPP::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    size_t elemsize = bottom_blob.elemsize;

    // 1 + 4 + 16 + 64 + ... + (2*pyramid_height)^2
    int pyramid_num_bins = ((1 << (pyramid_height * 2)) - 1) / 3;
    top_blob.create(pyramid_num_bins, 1, 2, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    float* pyramid_ptr = top_blob;

    // all spatial pyramids
    for (int p = 0; p < pyramid_height; p++)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c;

        int num_bins = 1 << p;

        int kernel_h = ceil(h / (float)num_bins);
        int stride_h = kernel_h;
        int remainder_h = stride_h * num_bins - h;
        int pad_h = (remainder_h + 1) / 2;

        int kernel_w = ceil(w / (float)num_bins);
        int stride_w = kernel_w;
        int remainder_w = stride_w * num_bins - w;
        int pad_w = (remainder_w + 1) / 2;

        // max value in NxN window
        // avg value in NxN window

        int outw = num_bins;
        int outh = num_bins;

        Mat bottom_blob_bordered = bottom_blob;
        if (pad_h > 0 || pad_w > 0)
        {
            copy_make_border(bottom_blob, bottom_blob_bordered, pad_h, pad_h, pad_w, pad_w, BORDER_CONSTANT, 0.f, opt);
            if (bottom_blob_bordered.empty())
                return -100;

            w = bottom_blob_bordered.w;
            h = bottom_blob_bordered.h;
        }

        const int maxk = kernel_h * kernel_w;

        // kernel offsets
        std::vector<int> _space_ofs(maxk);
        int* space_ofs = &_space_ofs[0];
        {
            int p1 = 0;
            int p2 = 0;
            int gap = w - kernel_w;
            for (int i = 0; i < kernel_h; i++)
            {
                for (int j = 0; j < kernel_w; j++)
                {
                    space_ofs[p1] = p2;
                    p1++;
                    p2++;
                }
                p2 += gap;
            }
        }

        if (pooling_type == PoolMethod_MAX)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const Mat m(w, h, bottom_blob_bordered.channel(q));
                float* outptr = pyramid_ptr + outh * outw * q;

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        const float* sptr = m.row(i*stride_h) + j*stride_w;

                        float max = sptr[0];

                        for (int k = 0; k < maxk; k++)
                        {
                            float val = sptr[ space_ofs[k] ];
                            max = std::max(max, val);
                        }

                        outptr[j] = max;
                    }

                    outptr += outw;
                }
            }
        }
        else if (pooling_type == PoolMethod_AVE)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const Mat m(w, h, bottom_blob_bordered.channel(q));
                float* outptr = pyramid_ptr + outh * outw * q;

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        const float* sptr = m.row(i*stride_h) + j*stride_w;

                        float sum = 0;

                        for (int k = 0; k < maxk; k++)
                        {
                            float val = sptr[ space_ofs[k] ];
                            sum += val;
                        }

                        outptr[j] = sum / maxk;
                    }

                    outptr += outw;
                }
            }
        }

        pyramid_ptr += channels * outh * outw;
    }

    return 0;
}